

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O3

void google::LogDestination::WaitForSinks(LogMessageData *data)

{
  int iVar1;
  ulong uVar2;
  ReaderMutexLock l;
  ReaderMutexLock local_20;
  
  local_20.mu_ = (Mutex *)sink_mutex_;
  if (sink_mutex_[0x38] == '\x01') {
    iVar1 = pthread_rwlock_rdlock((pthread_rwlock_t *)sink_mutex_);
    if (iVar1 != 0) {
      abort();
    }
  }
  if (sinks_ != (long *)0x0) {
    uVar2 = (ulong)(sinks_[1] - *sinks_) >> 3 & 0xffffffff;
    while( true ) {
      uVar2 = uVar2 - 1;
      if ((int)(uint)uVar2 < 0) break;
      (**(code **)(**(long **)(*sinks_ + (ulong)((uint)uVar2 & 0x7fffffff) * 8) + 0x18))();
    }
  }
  if ((((code *)data->send_method_ == LogMessage::SendToSink ||
        (code *)data->send_method_ == LogMessage::SendToSinkAndLog) &&
      (*(long *)&data->field_0x76a8 == 0)) &&
     ((data->field_6).outvec_ !=
      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)0x0)) {
    (**(code **)((long)&((((data->field_6).outvec_)->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start)->field_2 + 8))();
  }
  ::glog_internal_namespace_::ReaderMutexLock::~ReaderMutexLock(&local_20);
  return;
}

Assistant:

inline void LogDestination::WaitForSinks(LogMessage::LogMessageData* data) {
  ReaderMutexLock l(&sink_mutex_);
  if (sinks_) {
    for (int i = sinks_->size() - 1; i >= 0; i--) {
      (*sinks_)[i]->WaitTillSent();
    }
  }
  const bool send_to_sink =
      (data->send_method_ == &LogMessage::SendToSink) ||
      (data->send_method_ == &LogMessage::SendToSinkAndLog);
  if (send_to_sink && data->sink_ != NULL) {
    data->sink_->WaitTillSent();
  }
}